

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

bool __thiscall
p2t::Sweep::AngleExceedsPlus90DegreesOrIsNegative(Sweep *this,Point *origin,Point *pa,Point *pb)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = pa->x - origin->x;
  dVar3 = pa->y - origin->y;
  dVar1 = pb->x - origin->x;
  dVar4 = pb->y - origin->y;
  dVar1 = atan2(dVar2 * dVar4 - dVar1 * dVar3,dVar1 * dVar2 + dVar4 * dVar3);
  return (bool)((-(dVar1 < 0.0) | -(1.5707963267948966 < dVar1)) & 1);
}

Assistant:

bool Sweep::AngleExceedsPlus90DegreesOrIsNegative(const Point* origin, const Point* pa, const Point* pb) const {
  const double angle = Angle(origin, pa, pb);
  return (angle > PI_div2) || (angle < 0);
}